

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O1

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::InterleavedRewriter>::
visit<slang::syntax::TypedefDeclarationSyntax&>
          (SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::InterleavedRewriter> *this,
          TypedefDeclarationSyntax *t)

{
  Token *this_00;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
  *arrays_;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
  *arrays__00;
  undefined4 uVar1;
  SyntaxNode *syntax;
  iterator iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Symbol *pSVar6;
  ulong uVar7;
  logic_error *this_01;
  value_type *elements;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  char cVar17;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  string_view sVar24;
  StringRef macroName;
  string_view text;
  string_view fmt;
  string_view fmt_00;
  StringRef capturedExpression;
  format_args args;
  format_args args_00;
  locator res_2;
  AssertionHandler catchAssertionHandler;
  EnumType *type;
  try_emplace_args_t local_101;
  TypedefDeclarationSyntax *local_100;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
  *local_f8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_f0;
  string local_e8;
  SyntaxNode *local_c8;
  SyntaxNode *local_c0;
  AssertionHandler local_b8;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong local_58;
  Symbol *local_50;
  ITransientExpression local_48;
  Symbol **local_38;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar12;
  
  syntax = (SyntaxNode *)(t->type).ptr;
  if (syntax->kind != EnumType) {
    return;
  }
  local_50 = SemanticModel::getDeclaredSymbol((SemanticModel *)(this + 0xd80),syntax);
  local_e8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/VisitorTests.cpp"
  ;
  local_e8._M_string_length = 0x1b0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 4;
  capturedExpression.m_start = "type";
  aVar12 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)0x4;
  Catch::AssertionHandler::AssertionHandler
            (&local_b8,macroName,(SourceLineInfo *)&local_e8,capturedExpression,Normal);
  local_48.m_result = local_50 != (Symbol *)0x0;
  local_48.m_isBinaryExpression = false;
  local_48._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cb6980;
  local_38 = &local_50;
  Catch::AssertionHandler::handleExpr(&local_b8,&local_48);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  pSVar6 = local_50;
  if (*(int *)&local_50[1].originatingSyntax != 0) {
    ast::Scope::elaborate((Scope *)&local_50[1].name._M_str);
  }
  pcVar8 = (char *)0x0;
  for (pSVar6 = pSVar6[1].nextInScope; pSVar6 != (Symbol *)0x0; pSVar6 = pSVar6->nextInScope) {
    pcVar8 = pcVar8 + 1;
  }
  this_00 = &t->name;
  sVar24 = parsing::Token::valueText(this_00);
  local_b8.m_assertionInfo.macroName.m_start = sVar24._M_str;
  local_b8.m_assertionInfo.macroName.m_size = sVar24._M_len;
  fmt.size_ = 0x4d;
  fmt.data_ = (char *)0x24;
  args.field_1.args_ = aVar12.args_;
  args.desc_ = (unsigned_long_long)&local_b8;
  local_b8.m_assertionInfo.lineInfo.file = pcVar8;
  ::fmt::v11::vformat_abi_cxx11_(&local_e8,(v11 *)"\n    localparam int {}__count1 = {};",fmt,args);
  sVar24._M_str = local_e8._M_dataplus._M_p;
  sVar24._M_len = local_e8._M_string_length;
  local_c8 = SyntaxRewriter<InterleavedRewriter>::parse
                       ((SyntaxRewriter<InterleavedRewriter> *)this,sVar24);
  local_c0 = (SyntaxNode *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_f8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
              *)(this + 0x20);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = t;
  uVar15 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar7 = uVar15 >> ((byte)this[0x20] & 0x3f);
  uStack_60 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar15 & 0xff];
  local_f0._0_4_ = (uint)uVar15 & 7;
  local_f0._4_4_ = 0;
  local_58 = *(ulong *)(this + 0x28);
  uVar9 = 0;
  local_68 = CONCAT44(uStack_60,uStack_60);
  uVar11 = uVar7;
  do {
    pcVar13 = (char *)(*(long *)(this + 0x30) + uVar11 * 0x10);
    cVar17 = (char)uStack_60;
    auVar18[0] = -(*pcVar13 == cVar17);
    cVar20 = (char)((uint)uStack_60 >> 8);
    auVar18[1] = -(pcVar13[1] == cVar20);
    cVar21 = (char)((uint)uStack_60 >> 0x10);
    auVar18[2] = -(pcVar13[2] == cVar21);
    cVar22 = (char)((uint)uStack_60 >> 0x18);
    auVar18[3] = -(pcVar13[3] == cVar22);
    auVar18[4] = -(pcVar13[4] == cVar17);
    auVar18[5] = -(pcVar13[5] == cVar20);
    auVar18[6] = -(pcVar13[6] == cVar21);
    auVar18[7] = -(pcVar13[7] == cVar22);
    auVar18[8] = -(pcVar13[8] == cVar17);
    auVar18[9] = -(pcVar13[9] == cVar20);
    auVar18[10] = -(pcVar13[10] == cVar21);
    auVar18[0xb] = -(pcVar13[0xb] == cVar22);
    auVar18[0xc] = -(pcVar13[0xc] == cVar17);
    auVar18[0xd] = -(pcVar13[0xd] == cVar20);
    auVar18[0xe] = -(pcVar13[0xe] == cVar21);
    auVar18[0xf] = -(pcVar13[0xf] == cVar22);
    uVar14 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    if (uVar14 != 0) {
      lVar10 = *(long *)(this + 0x38) + uVar11 * 0x1e0;
      do {
        iVar3 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
          }
        }
        aVar12 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                 ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                 (lVar10 + (ulong)(uint)(iVar3 << 5)))->values_;
        if ((TypedefDeclarationSyntax *)aVar12.values_ == t) {
          pcVar13 = (char *)((ulong)(uint)(iVar3 << 5) + lVar10);
          goto LAB_0049425b;
        }
        uVar14 = uVar14 - 1 & uVar14;
      } while (uVar14 != 0);
    }
    if ((*(byte *)(uVar11 * 0x10 + *(long *)(this + 0x30) + 0xf) &
        (byte)*(try_emplace_args_t *)(local_f0.values_ + 0x9588a)) == 0) break;
    lVar10 = uVar11 + uVar9;
    uVar9 = uVar9 + 1;
    uVar11 = lVar10 + 1U & local_58;
  } while (uVar9 <= local_58);
  pcVar13 = (char *)0x0;
  aVar12 = local_f0;
LAB_0049425b:
  local_e8._M_dataplus._M_p = (pointer)t;
  uStack_5c = uStack_60;
  if (pcVar13 == (char *)0x0) {
    if (*(ulong *)(this + 0x48) < *(ulong *)(this + 0x40)) {
      aVar12.values_ = (value<fmt::v11::context> *)&local_100;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&local_b8,local_f8,(arrays_type *)local_f8,uVar7,uVar15,
                 (try_emplace_args_t *)aVar12.values_,(SyntaxNode **)&local_e8);
      *(long *)(this + 0x48) = *(long *)(this + 0x48) + 1;
      pcVar13 = local_b8.m_assertionInfo.lineInfo.file;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&local_b8,local_f8,uVar15,(try_emplace_args_t *)&local_100,
                 (SyntaxNode **)&local_e8);
      pcVar13 = local_b8.m_assertionInfo.lineInfo.file;
    }
  }
  local_b8.m_assertionInfo.macroName.m_size = (size_type)local_c8;
  local_b8.m_assertionInfo.macroName.m_start = (char *)t;
  parsing::Token::Token((Token *)&local_b8.m_assertionInfo.lineInfo);
  iVar2._M_current = *(SyntaxChange **)(pcVar13 + 0x10);
  if (iVar2._M_current == *(SyntaxChange **)(pcVar13 + 0x18)) {
    std::
    vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
    ::_M_realloc_insert<slang::syntax::detail::SyntaxChange>
              ((vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
                *)(pcVar13 + 8),iVar2,(SyntaxChange *)&local_b8);
  }
  else {
    *(char **)&(iVar2._M_current)->separator = local_b8.m_assertionInfo.lineInfo.file;
    ((iVar2._M_current)->separator).info = (Info *)local_b8.m_assertionInfo.lineInfo.line;
    (iVar2._M_current)->first = (SyntaxNode *)local_b8.m_assertionInfo.macroName.m_start;
    (iVar2._M_current)->second = (SyntaxNode *)local_b8.m_assertionInfo.macroName.m_size;
    *(long *)(pcVar13 + 0x10) = *(long *)(pcVar13 + 0x10) + 0x20;
  }
  sVar24 = parsing::Token::valueText((Token *)local_c0);
  local_b8.m_assertionInfo.macroName.m_start = sVar24._M_str;
  local_b8.m_assertionInfo.macroName.m_size = sVar24._M_len;
  fmt_00.size_ = 0x4d;
  fmt_00.data_ = (char *)0x24;
  args_00.field_1.args_ = aVar12.args_;
  args_00.desc_ = (unsigned_long_long)&local_b8;
  local_b8.m_assertionInfo.lineInfo.file = pcVar8;
  ::fmt::v11::vformat_abi_cxx11_
            (&local_e8,(v11 *)"\n    localparam int {}__count2 = {};",fmt_00,args_00);
  text._M_str = local_e8._M_dataplus._M_p;
  text._M_len = local_e8._M_string_length;
  local_c0 = SyntaxRewriter<InterleavedRewriter>::parse
                       ((SyntaxRewriter<InterleavedRewriter> *)this,text);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
             *)(this + 0x50);
  uVar9 = uVar15 >> ((byte)this[0x50] & 0x3f);
  local_f8 = *(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
               **)(this + 0x58);
  uVar11 = uVar9;
  uVar7 = 0;
  do {
    local_c8 = (SyntaxNode *)uVar7;
    pcVar8 = (char *)(*(long *)(this + 0x60) + uVar11 * 0x10);
    auVar19[0] = -(*pcVar8 == (char)local_68);
    auVar19[1] = -(pcVar8[1] == local_68._1_1_);
    auVar19[2] = -(pcVar8[2] == local_68._2_1_);
    auVar19[3] = -(pcVar8[3] == local_68._3_1_);
    auVar19[4] = -(pcVar8[4] == local_68._4_1_);
    auVar19[5] = -(pcVar8[5] == local_68._5_1_);
    auVar19[6] = -(pcVar8[6] == local_68._6_1_);
    auVar19[7] = -(pcVar8[7] == local_68._7_1_);
    auVar19[8] = -(pcVar8[8] == (char)uStack_60);
    auVar19[9] = -(pcVar8[9] == uStack_60._1_1_);
    auVar19[10] = -(pcVar8[10] == uStack_60._2_1_);
    auVar19[0xb] = -(pcVar8[0xb] == uStack_60._3_1_);
    auVar19[0xc] = -(pcVar8[0xc] == (char)uStack_5c);
    auVar19[0xd] = -(pcVar8[0xd] == uStack_5c._1_1_);
    auVar19[0xe] = -(pcVar8[0xe] == uStack_5c._2_1_);
    auVar19[0xf] = -(pcVar8[0xf] == uStack_5c._3_1_);
    uVar14 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
    if (uVar14 != 0) {
      lVar10 = *(long *)(this + 0x68) + uVar11 * 0x1e0;
      do {
        iVar3 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
          }
        }
        if (*(TypedefDeclarationSyntax **)(lVar10 + (ulong)(uint)(iVar3 << 5)) == t) {
          pcVar8 = (char *)((ulong)(uint)(iVar3 << 5) + lVar10);
          goto LAB_0049441d;
        }
        uVar14 = uVar14 - 1 & uVar14;
      } while (uVar14 != 0);
    }
    if ((*(byte *)(uVar11 * 0x10 + *(long *)(this + 0x60) + 0xf) &
        (byte)*(try_emplace_args_t *)(local_f0.values_ + 0x9588a)) == 0) break;
    uVar11 = (long)local_c8 + 1U + uVar11 & (ulong)local_f8;
    uVar7 = (long)local_c8 + 1U;
  } while ((long)local_c8 + 1U <= local_f8);
  pcVar8 = (char *)0x0;
LAB_0049441d:
  local_e8._M_dataplus._M_p = (pointer)t;
  if (pcVar8 == (char *)0x0) {
    if (*(ulong *)(this + 0x78) < *(ulong *)(this + 0x70)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&local_b8,arrays_,(arrays_type *)arrays_,uVar9,uVar15,
                 (try_emplace_args_t *)&local_100,(SyntaxNode **)&local_e8);
      *(long *)(this + 0x78) = *(long *)(this + 0x78) + 1;
      pcVar8 = local_b8.m_assertionInfo.lineInfo.file;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&local_b8,arrays_,uVar15,(try_emplace_args_t *)&local_100,
                 (SyntaxNode **)&local_e8);
      pcVar8 = local_b8.m_assertionInfo.lineInfo.file;
    }
  }
  local_b8.m_assertionInfo.macroName.m_size = (size_type)local_c0;
  local_b8.m_assertionInfo.macroName.m_start = (char *)t;
  parsing::Token::Token((Token *)&local_b8.m_assertionInfo.lineInfo);
  iVar2._M_current = *(SyntaxChange **)(pcVar8 + 0x10);
  if (iVar2._M_current == *(SyntaxChange **)(pcVar8 + 0x18)) {
    std::
    vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
    ::_M_realloc_insert<slang::syntax::detail::SyntaxChange>
              ((vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
                *)(pcVar8 + 8),iVar2,(SyntaxChange *)&local_b8);
  }
  else {
    *(char **)&(iVar2._M_current)->separator = local_b8.m_assertionInfo.lineInfo.file;
    ((iVar2._M_current)->separator).info = (Info *)local_b8.m_assertionInfo.lineInfo.line;
    (iVar2._M_current)->first = (SyntaxNode *)local_b8.m_assertionInfo.macroName.m_start;
    (iVar2._M_current)->second = (SyntaxNode *)local_b8.m_assertionInfo.macroName.m_size;
    *(long *)(pcVar8 + 0x10) = *(long *)(pcVar8 + 0x10) + 0x20;
  }
  arrays__00 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
                *)(this + 0x80);
  local_b8.m_assertionInfo.macroName.m_size = 0;
  local_100 = t;
  local_b8.m_assertionInfo.macroName.m_start = (char *)t;
  parsing::Token::Token((Token *)&local_b8.m_assertionInfo.lineInfo);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_100;
  uVar15 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar9 = uVar15 >> ((byte)this[0x80] & 0x3f);
  uVar1 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar15 & 0xff];
  local_68 = *(ulong *)(this + 0x88);
  uVar11 = uVar9;
  uVar7 = 0;
  do {
    local_f0 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)uVar7;
    pcVar8 = (char *)(*(long *)(this + 0x90) + uVar11 * 0x10);
    cVar17 = (char)uVar1;
    auVar23[0] = -(*pcVar8 == cVar17);
    cVar20 = (char)((uint)uVar1 >> 8);
    auVar23[1] = -(pcVar8[1] == cVar20);
    cVar21 = (char)((uint)uVar1 >> 0x10);
    auVar23[2] = -(pcVar8[2] == cVar21);
    cVar22 = (char)((uint)uVar1 >> 0x18);
    auVar23[3] = -(pcVar8[3] == cVar22);
    auVar23[4] = -(pcVar8[4] == cVar17);
    auVar23[5] = -(pcVar8[5] == cVar20);
    auVar23[6] = -(pcVar8[6] == cVar21);
    auVar23[7] = -(pcVar8[7] == cVar22);
    auVar23[8] = -(pcVar8[8] == cVar17);
    auVar23[9] = -(pcVar8[9] == cVar20);
    auVar23[10] = -(pcVar8[10] == cVar21);
    auVar23[0xb] = -(pcVar8[0xb] == cVar22);
    auVar23[0xc] = -(pcVar8[0xc] == cVar17);
    auVar23[0xd] = -(pcVar8[0xd] == cVar20);
    auVar23[0xe] = -(pcVar8[0xe] == cVar21);
    auVar23[0xf] = -(pcVar8[0xf] == cVar22);
    uVar14 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
    if (uVar14 != 0) {
      lVar10 = *(long *)(this + 0x98) + uVar11 * 0x2d0;
      do {
        iVar3 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
          }
        }
        if (local_100 == *(TypedefDeclarationSyntax **)(lVar10 + (ulong)(uint)(iVar3 * 0x30))) {
          bVar16 = (ulong)(uint)(iVar3 * 0x30) + lVar10 == 0;
          goto LAB_004945de;
        }
        uVar14 = uVar14 - 1 & uVar14;
      } while (uVar14 != 0);
    }
    bVar16 = true;
    if ((*(byte *)(uVar11 * 0x10 + *(long *)(this + 0x90) + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7]) == 0) break;
    uVar11 = (long)local_f0.values_ + 1U + uVar11 & local_68;
    uVar7 = (long)local_f0.values_ + 1U;
  } while ((long)local_f0.values_ + 1U <= local_68);
LAB_004945de:
  if (bVar16) {
    if (*(ulong *)(this + 0xa8) < *(ulong *)(this + 0xa0)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,slang::syntax::detail::RemoveChange>
                ((locator *)&local_e8,arrays__00,(arrays_type *)arrays__00,uVar9,uVar15,&local_101,
                 (SyntaxNode **)&local_100,(RemoveChange *)&local_b8);
      *(long *)(this + 0xa8) = *(long *)(this + 0xa8) + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,slang::syntax::detail::RemoveChange>
                ((locator *)&local_e8,arrays__00,uVar15,&local_101,(SyntaxNode **)&local_100,
                 (RemoveChange *)&local_b8);
    }
    if (bVar16) {
      return;
    }
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"Node only permit one remove/replace operation");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void visit(T&& t) {
        if constexpr (requires { DERIVED->handle(t); })
            DERIVED->handle(t);
        else
            DERIVED->visitDefault(t);
    }